

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Triangle::SolidAngle(Triangle *this,Point3f *p)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Float FVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3<float> VVar10;
  Vector3<float> VVar11;
  Vector3<float> VVar12;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Point3,_float> local_48;
  Tuple3<pbrt::Point3,_float> local_38;
  Tuple3<pbrt::Point3,_float> local_28;
  
  auVar9 = in_ZMM0._8_56_;
  lVar3 = (long)this->triIndex * 0xc;
  lVar1 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar2 = *(long *)(lVar1 + 8);
  lVar1 = *(long *)(lVar1 + 0x10);
  lVar4 = (long)*(int *)(lVar2 + lVar3) * 0xc;
  local_28.z = *(float *)(lVar1 + 8 + lVar4);
  local_28._0_8_ = *(undefined8 *)(lVar1 + lVar4);
  lVar4 = (long)*(int *)(lVar2 + 4 + lVar3) * 0xc;
  local_38.z = *(float *)(lVar1 + 8 + lVar4);
  local_38._0_8_ = *(undefined8 *)(lVar1 + lVar4);
  lVar2 = (long)*(int *)(lVar2 + 8 + lVar3) * 0xc;
  local_48.z = *(float *)(lVar1 + 8 + lVar2);
  local_48._0_8_ = *(undefined8 *)(lVar1 + lVar2);
  VVar10 = Point3<float>::operator-((Point3<float> *)&local_28,p);
  local_58.z = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar9;
  local_58._0_8_ = vmovlps_avx(auVar6._0_16_);
  VVar10 = Normalize<float>((Vector3<float> *)&local_58);
  VVar11 = Point3<float>::operator-((Point3<float> *)&local_38,p);
  local_68.z = VVar11.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_68._0_8_ = vmovlps_avx(auVar7._0_16_);
  VVar11 = Normalize<float>((Vector3<float> *)&local_68);
  VVar12 = Point3<float>::operator-((Point3<float> *)&local_48,p);
  local_78.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar9;
  local_78._0_8_ = vmovlps_avx(auVar8._0_16_);
  VVar12 = Normalize<float>((Vector3<float> *)&local_78);
  FVar5 = SphericalTriangleArea
                    ((Vector3f)VVar10.super_Tuple3<pbrt::Vector3,_float>,
                     (Vector3f)VVar11.super_Tuple3<pbrt::Vector3,_float>,
                     (Vector3f)VVar12.super_Tuple3<pbrt::Vector3,_float>);
  return FVar5;
}

Assistant:

PBRT_CPU_GPU
    Float SolidAngle(const Point3f &p) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        return SphericalTriangleArea(Normalize(p0 - p), Normalize(p1 - p),
                                     Normalize(p2 - p));
    }